

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O2

size_t __thiscall nuraft::timer_helper::get_duration_us(timer_helper *this)

{
  size_t sVar1;
  
  std::mutex::lock(&this->lock_);
  sVar1 = this->duration_us_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return sVar1;
}

Assistant:

size_t get_duration_us() const {
        std::lock_guard<std::mutex> l(lock_);
        return duration_us_;
    }